

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::ExtensionMethodName_abi_cxx11_
                   (FieldDescriptor *descriptor)

{
  string *in_RSI;
  string *in_RDI;
  bool in_stack_00000017;
  string *in_stack_00000018;
  string result;
  string name;
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [48];
  string local_50 [32];
  string local_30 [16];
  string *in_stack_ffffffffffffffe0;
  string *in_stack_ffffffffffffffe8;
  string *prefix;
  
  prefix = in_RDI;
  (anonymous_namespace)::NameFromFieldDescriptor_abi_cxx11_((FieldDescriptor *)in_RDI);
  anon_unknown_0::UnderscoresToCamelCase(in_stack_00000018,in_stack_00000017);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"",&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"_Extension",&local_a9);
  anon_unknown_0::SanitizeNameForObjC
            (prefix,in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

string ExtensionMethodName(const FieldDescriptor* descriptor) {
  const string name = NameFromFieldDescriptor(descriptor);
  const string result = UnderscoresToCamelCase(name, false);
  return SanitizeNameForObjC("", result, "_Extension", NULL);
}